

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

uint encodeAddress(uchar *stream,x86Reg index,int multiplier,x86Reg base,int displacement,
                  uint spareField)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  byte local_36;
  byte local_35;
  byte local_34;
  byte local_32;
  uchar sibIndex;
  uchar sibScale;
  uchar sibBase;
  uchar RM;
  uchar spare;
  uchar mod;
  bool dispImm8;
  uchar *start;
  uint spareField_local;
  int displacement_local;
  x86Reg base_local;
  int multiplier_local;
  x86Reg index_local;
  uchar *stream_local;
  
  if (index == rESP) {
    __assert_fail("index != rESP",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                  ,0x3b,
                  "unsigned int encodeAddress(unsigned char *, x86Reg, int, x86Reg, int, unsigned int)"
                 );
  }
  if (spareField < 0x10) {
    bVar2 = (char)(byte)displacement != displacement;
    local_32 = 0;
    if (displacement != 0) {
      if (bVar2 || base == rNONE) {
        local_32 = 0x80;
      }
      else {
        local_32 = 0x40;
      }
    }
    if ((displacement == 0) && (base == rEBP)) {
      local_32 = 0x40;
    }
    if ((displacement == 0) && (base == rR13)) {
      local_32 = 0x40;
    }
    if ((index == rNONE) && (base == rNONE)) {
      local_32 = 0;
    }
    local_34 = regCode[7];
    if (base != rNONE) {
      local_34 = regCode[base];
    }
    if (index != rNONE) {
      local_34 = regCode[5];
    }
    local_35 = regCode[base];
    if ((index != rNONE) && (base == rNONE)) {
      local_32 = 0;
      local_35 = regCode[7];
    }
    *stream = local_32 | (byte)((spareField & 7) << 3) | local_34;
    local_36 = 0;
    if (multiplier == 2) {
      local_36 = 0x40;
    }
    else if (multiplier == 4) {
      local_36 = 0x80;
    }
    else if (multiplier == 8) {
      local_36 = 0xc0;
    }
    bVar3 = true;
    if ((((multiplier != 0) && (bVar3 = true, multiplier != 1)) && (bVar3 = true, multiplier != 2))
       && (bVar3 = true, multiplier != 4)) {
      bVar3 = multiplier == 8;
    }
    if (!bVar3) {
      __assert_fail("multiplier == 0 || multiplier == 1 || multiplier == 2 || multiplier == 4 || multiplier == 8"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                    ,0x6e,
                    "unsigned int encodeAddress(unsigned char *, x86Reg, int, x86Reg, int, unsigned int)"
                   );
    }
    cVar1 = regCode[5];
    if (index != rNONE) {
      cVar1 = regCode[index];
    }
    if (((index != rNONE) || (base == rESP)) || (_multiplier_local = stream + 1, base == rR12)) {
      _multiplier_local = stream + 2;
      stream[1] = local_36 | cVar1 << 3 | local_35;
    }
    if (bVar2 || base == rNONE) {
      *(int *)_multiplier_local = displacement;
      multiplier_local = (int)_multiplier_local + 4;
    }
    else {
      *_multiplier_local = (byte)displacement;
      if (local_32 != 0) {
        _multiplier_local = _multiplier_local + 1;
      }
    }
    return multiplier_local - (int)stream;
  }
  __assert_fail("spareField < 16",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                ,0x3c,
                "unsigned int encodeAddress(unsigned char *, x86Reg, int, x86Reg, int, unsigned int)"
               );
}

Assistant:

unsigned int	encodeAddress(unsigned char* stream, x86Reg index, int multiplier, x86Reg base, int displacement, unsigned spareField)
{
	assert(index != rESP);
	assert(spareField < 16);

	unsigned char* start = stream;

	bool dispImm8 = (char)(displacement) == displacement && base != rNONE;

	unsigned char mod = 0;
	if(displacement)
	{
		if(dispImm8)
			mod = 1 << 6;
		else
			mod = 2 << 6;
	}

	// special case: [ebp] should be encoded as [ebp+0]
	if(displacement == 0 && base == rEBP)
		mod = 1 << 6;

	// special case: [r13] should be encoded as [r13+0]
	if(displacement == 0 && base == rR13)
		mod = 1 << 6;

	if(index == rNONE && base == rNONE)
		mod = 0;

	unsigned char spare = (unsigned char)(spareField & 0x7) << 3;

	unsigned char RM = regCode[rEBP]; // by default, it's simply [displacement]
	if(base != rNONE)
		RM = regCode[base];	// this is [base + displacement]
	if(index != rNONE)
		RM = regCode[rESP];	// this changes mode to [index*multiplier + base + displacement]

	unsigned char sibBase = regCode[base];

	if(index != rNONE && base == rNONE)
	{
		mod = 0;
		sibBase = regCode[rEBP];
	}

	*stream++ = mod | spare | RM;
	unsigned char sibScale = 0;
	if(multiplier == 2)
		sibScale = 1 << 6;
	else if(multiplier == 4)
		sibScale = 2 << 6;
	else if(multiplier == 8)
		sibScale = 3 << 6;
	assert(multiplier == 0 || multiplier == 1 || multiplier == 2 || multiplier == 4 || multiplier == 8);

	unsigned char sibIndex = (index != rNONE ? regCode[index] << 3 : regCode[rESP] << 3);
	
	if(index != rNONE || base == rESP || base == rR12)
		*stream++ = sibScale | sibIndex | sibBase;
	
	if(dispImm8)
	{
		*stream = (char)displacement;
		if(mod)
			stream++;
	}
	else
	{
		memcpy(stream, &displacement, sizeof(displacement));
		stream += sizeof(displacement);
	}
	return (int)(stream - start);
}